

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

void DataBlobSourceCallback(DataBlob *blob,void *userData)

{
  DataBlob_private *pDVar1;
  hrgls_DataBlob in_RAX;
  hrgls_Status hVar2;
  hrgls_DataBlob blobToCopy;
  hrgls_DataBlob copy;
  hrgls_DataBlob local_18;
  
  if ((userData != (void *)0x0) && (*(long *)((long)userData + 8) != 0)) {
    pDVar1 = blob->m_private;
    blobToCopy = (hrgls_DataBlob)0x0;
    if (pDVar1 != (DataBlob_private *)0x0) {
      blobToCopy = pDVar1->blob;
      hVar2 = 0;
      if (blobToCopy == (hrgls_DataBlob)0x0) {
        hVar2 = 0x3ee;
      }
      pDVar1->status = hVar2;
    }
    local_18 = in_RAX;
    hrgls_DataBlobCopy(&local_18,blobToCopy);
    (**(code **)((long)userData + 8))(local_18,*(undefined8 *)((long)userData + 0x10));
  }
  return;
}

Assistant:

static void DataBlobSourceCallback(hrgls::datablob::DataBlob &blob, void *userData)
{
  // Get a pointer to the information we need to service the callback.
  if (!userData) { return; }
  hrgls_DataBlobSource info = static_cast<hrgls_DataBlobSource>(userData);

  if (info->CHandler) {
    // Make a copy of the blob to hand to the callback handler so that
    // they will destroy it just as they would one that is returned by
    // GetNextBlob().  This is extra work for this case, but it makes the
    // interface consistent between these two cases.
    hrgls_DataBlob copy;
    hrgls_DataBlobCopy(&copy, blob.RawDataBlob());
    info->CHandler(copy, info->CUserData);
  }
}